

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring64_bitmap_t * roaring64_bitmap_of_ptr(size_t n_args,uint64_t *vals)

{
  roaring64_bitmap_t *r;
  
  r = roaring64_bitmap_create();
  roaring64_bitmap_add_many(r,n_args,vals);
  return r;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_of_ptr(size_t n_args,
                                            const uint64_t *vals) {
    roaring64_bitmap_t *r = roaring64_bitmap_create();
    roaring64_bitmap_add_many(r, n_args, vals);
    return r;
}